

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageLoader::do_dynamic_link(CVmImageLoader *this)

{
  long in_RDI;
  CVmHashEntryExport *entry;
  sym_assoc_t *ip;
  sym_assoc_t imports [71];
  undefined4 in_stack_fffffffffffff6d8;
  int in_stack_fffffffffffff6dc;
  undefined8 in_stack_fffffffffffff6e0;
  int in_root_set;
  CVmImageFile *in_stack_fffffffffffff6e8;
  char *in_stack_fffffffffffff6f0;
  CVmHashTable *in_stack_fffffffffffff6f8;
  CVmHashEntry *in_stack_fffffffffffff708;
  vm_prop_id_t last_prop;
  CVmImageLoader *this_00;
  undefined1 local_8e8 [12];
  vm_obj_id_t in_stack_fffffffffffff724;
  char *in_stack_fffffffffffff728;
  CVmImageLoader *in_stack_fffffffffffff730;
  
  memcpy(local_8e8,&PTR_anon_var_dwarf_1385ae_003e59a0,0x8e0);
  CVmPredef::reset(&G_predef_X);
  this_00 = (CVmImageLoader *)local_8e8;
  do {
    in_root_set = (int)((ulong)in_stack_fffffffffffff6e0 >> 0x20);
    last_prop = (vm_prop_id_t)((ulong)in_stack_fffffffffffff708 >> 0x30);
    if (this_00->fp_ == (CVmImageFile *)0x0) {
      if (G_predef_X.last_prop_obj == 0) {
        G_predef_X.last_prop_obj =
             CVmObjVector::create
                       (in_root_set,CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
        add_synth_export_obj
                  (in_stack_fffffffffffff730,in_stack_fffffffffffff728,in_stack_fffffffffffff724);
        set_last_prop(this_00,last_prop);
      }
      if (G_predef_X.rterrmsg_prop == 0) {
        G_predef_X.rterrmsg_prop = alloc_new_prop(this_00);
        add_synth_export_prop
                  (in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                   (vm_prop_id_t)(in_stack_fffffffffffff724 >> 0x10));
      }
      if (G_predef_X.const_str_obj == 0) {
        G_predef_X.const_str_obj =
             CVmObjString::create
                       (in_root_set,CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
        add_synth_export_obj
                  (in_stack_fffffffffffff730,in_stack_fffffffffffff728,in_stack_fffffffffffff724);
      }
      if (G_predef_X.const_lst_obj == 0) {
        G_predef_X.const_lst_obj =
             CVmObjList::create(in_root_set,
                                CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
        add_synth_export_obj
                  (in_stack_fffffffffffff730,in_stack_fffffffffffff728,in_stack_fffffffffffff724);
      }
      return;
    }
    in_stack_fffffffffffff708 = (CVmHashEntry *)0x0;
    if ((int)this_00->base_seek_ofs_ == 0) {
      in_stack_fffffffffffff6f0 = *(char **)(in_RDI + 0x50);
      in_stack_fffffffffffff6f8 = (CVmHashTable *)this_00->fp_;
      strlen((char *)this_00->fp_);
      in_stack_fffffffffffff708 =
           CVmHashTable::find(in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,
                              (size_t)in_stack_fffffffffffff6e8);
    }
    if (in_stack_fffffffffffff708 == (CVmHashEntry *)0x0) {
      in_stack_fffffffffffff6e0 = *(undefined8 *)(in_RDI + 0x58);
      in_stack_fffffffffffff6e8 = this_00->fp_;
      strlen((char *)this_00->fp_);
      in_stack_fffffffffffff708 =
           CVmHashTable::find(in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,
                              (size_t)in_stack_fffffffffffff6e8);
    }
    if (in_stack_fffffffffffff708 != (CVmHashEntry *)0x0) {
      if (*(int *)&this_00->fname_ != *(int *)&in_stack_fffffffffffff708[1]._vptr_CVmHashEntry) {
        err_throw_a(0x14b,1,3,this_00->fp_);
      }
      in_stack_fffffffffffff6dc = *(int *)&this_00->fname_;
      if (in_stack_fffffffffffff6dc == 5) {
        *(undefined4 *)this_00->path_ = *(undefined4 *)&in_stack_fffffffffffff708[1].nxt_;
      }
      else if (in_stack_fffffffffffff6dc == 6) {
        *(undefined2 *)this_00->path_ = *(undefined2 *)&in_stack_fffffffffffff708[1].nxt_;
      }
      else if (in_stack_fffffffffffff6dc == 0xc) {
        *(undefined4 *)this_00->path_ = *(undefined4 *)&in_stack_fffffffffffff708[1].nxt_;
      }
    }
    this_00 = (CVmImageLoader *)&this_00->ver_;
  } while( true );
}

Assistant:

void CVmImageLoader::do_dynamic_link(VMG0_)
{
    struct sym_assoc_t
    {
        /* the symbol name */
        const char *sym;
        
        /* datatype */
        vm_datatype_t typ;
        
        /* address of predef table entry for this value */
        void *addr;

        /* 
         *   flag: this is a synthetic import, which means that we don't
         *   look for it in the image file, but only in the restored state 
         */
        int is_synthetic;
    };
    sym_assoc_t imports[] =
    {
        /* build the table by including the import list */
#define VM_IMPORT_OBJ(sym, mem)  { sym, VM_OBJ,  &G_predef->mem, FALSE },
#define VM_NOIMPORT_OBJ(sym, mem)  { sym, VM_OBJ,  &G_predef->mem, TRUE },
#define VM_IMPORT_PROP(sym, mem) { sym, VM_PROP, &G_predef->mem, FALSE },
#define VM_NOIMPORT_PROP(sym, mem) { sym, VM_PROP, &G_predef->mem, TRUE },
#define VM_IMPORT_FUNC(sym, mem) { sym, VM_FUNCPTR, &G_predef->mem, FALSE },
#include "vmimport.h"

        /* end the table */
        { 0, VM_NIL, 0, FALSE }
    };
    const sym_assoc_t *ip;

    /* reset all of the predefs to undefined */
    G_predef->reset();

    /*
     *   Run through our list of symbols to import from the load file, and
     *   load each one. 
     */
    for (ip = imports ; ip->sym != 0 ; ++ip)
    {
        CVmHashEntryExport *entry;

        /* presume we won't find it */
        entry = 0;

        /* 
         *   if it's not synthetic, look up this symbol in the image file's
         *   export table (don't look up synthetic symbols, because we
         *   always want to create these ourselves, not load them from an
         *   image file) 
         */
        if (!ip->is_synthetic)
        {
            /* it's a regular import - look for it in the image exports */
            entry = (CVmHashEntryExport *)exports_
                    ->find(ip->sym, strlen(ip->sym));
        }

        /* 
         *   if we didn't find the entry in the image file's exports, look
         *   in the synthesized exports, in case we're restoring state from
         *   a previous session 
         */
        if (entry == 0)
            entry = (CVmHashEntryExport *)synth_exports_
                    ->find(ip->sym, strlen(ip->sym));
        
        /* if the symbol isn't exported, skip it and proceed to the next */
        if (entry == 0)
            continue;

        /* 
         *   make sure the type of the symbol exported by the image file
         *   matches the type of value we want to import for the symbol 
         */
        if (ip->typ != entry->val_.typ)
        {
            /* the exported symbol has the wrong type - throw an error */
            err_throw_a(VMERR_INVAL_EXPORT_TYPE, 1, ERR_TYPE_CHAR, ip->sym);
        }

        /* set the value according to its type */
        switch(ip->typ)
        {
        case VM_OBJ:
            /* store the object value */
            *(vm_obj_id_t *)ip->addr = entry->val_.val.obj;
            break;

        case VM_PROP:
            *(vm_prop_id_t *)ip->addr = entry->val_.val.prop;
            break;

        case VM_FUNCPTR:
            *(pool_ofs_t *)ip->addr = entry->val_.val.ofs;
            break;

        default:
            /* we don't import any other types */
            break;
        }
    }

    /*
     *   If we don't already have one, create a vector to keep track of the
     *   last property ID allocated.  We store this in a vector object so
     *   that the property allocation mechanism easily integrates with the
     *   undo and save/restore mechanisms.  
     */
    if (G_predef->last_prop_obj == VM_INVALID_OBJ)
    {
        /* create the object */
        G_predef->last_prop_obj = CVmObjVector::create(vmg_ FALSE, 1);

        /* add it to the synthesized export list */
        add_synth_export_obj(VM_IMPORT_NAME_LASTPROPOBJ,
                             G_predef->last_prop_obj);

        /* 
         *   set up the object with the current last property, as indicated
         *   in the image file 
         */
        set_last_prop(vmg_ G_predef->last_prop);
    }

    /* 
     *   if the image didn't define an exceptionMessage property, allocate a
     *   new property ID for it 
     */
    if (G_predef->rterrmsg_prop == VM_INVALID_PROP)
    {
        /* allocate the property ID */
        G_predef->rterrmsg_prop = alloc_new_prop(vmg0_);

        /* add it to the synthesized export list */
        add_synth_export_prop(VM_IMPORT_NAME_RTERRMSG,
                              G_predef->rterrmsg_prop);
    }

    /* 
     *   Create the constant string and list placeholder objects - these are
     *   never imported from the image file, but must be dynamically created
     *   after loading is complete.
     *   
     *   Create these objects without values, since the values are
     *   irrelevant - they're needed only for their type information.  
     */
    if (G_predef->const_str_obj == VM_INVALID_OBJ)
    {
        /* allocate it */
        G_predef->const_str_obj = CVmObjString::create(vmg_ FALSE, 0);

        /* add it to the synthesized export list */
        add_synth_export_obj(VM_IMPORT_NAME_CONSTSTR,
                             G_predef->const_str_obj);
    }
    if (G_predef->const_lst_obj == VM_INVALID_OBJ)
    {
        /* allocate it */
        G_predef->const_lst_obj = CVmObjList::create(vmg_ FALSE, (size_t)0);

        /* add it to the synthesized export list */
        add_synth_export_obj(VM_IMPORT_NAME_CONSTLST,
                             G_predef->const_lst_obj);
    }
}